

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<13,_0,_9,_2,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  undefined4 uVar9;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3 m;
  float afStack_c0 [6];
  float local_a8 [2];
  undefined8 local_a0;
  undefined4 local_98;
  Matrix<float,_3,_3> local_8c;
  Matrix<float,_3,_3> local_68;
  Matrix<float,_3,_3> local_38;
  long lVar7;
  
  pfVar1 = (float *)&local_38;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[2] = 0.0;
  local_38.m_data.m_data[2].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[2] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[2] = 0.0;
  puVar2 = &s_constInMat3;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0x24);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 3);
  pfVar1 = (float *)&local_68;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar6 = _DAT_00632fe0;
    do {
      bVar8 = SUB164(auVar6 ^ _DAT_00625ae0,4) == -0x80000000 &&
              SUB164(auVar6 ^ _DAT_00625ae0,0) < -0x7ffffffd;
      if (bVar8) {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar5) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar9;
      }
      if (bVar8) {
        uVar9 = 0x3f800000;
        if (lVar3 + -0xc != lVar5) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5 + 0xc) = uVar9;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x30);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar1 = pfVar1 + 1;
  } while (lVar4 != 3);
  local_68.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  local_68.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  local_68.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  local_68.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  local_68.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  local_68.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  local_68.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  afStack_c0[0] = 4.431895e-39;
  afStack_c0[1] = 0.0;
  tcu::operator*(&local_8c,&local_38,&local_68);
  local_a0 = (ulong)local_a0._4_4_ << 0x20;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  lVar3 = 0;
  do {
    local_a8[lVar3] =
         local_8c.m_data.m_data[0].m_data[lVar3] + local_8c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_c0[4] = 0.0;
  afStack_c0[2] = 0.0;
  afStack_c0[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_c0[lVar3 + 2] =
         local_a8[lVar3] + *(float *)((long)(local_68.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a0 = 0x100000000;
  local_98 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a8[lVar3]] = afStack_c0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}